

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_filename.c
# Opt level: O3

void test_read_format_gtar_filename_eucJP_UTF8(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive_conflict *a;
  la_int64_t lVar4;
  archive_entry *ae;
  archive_entry *local_38;
  
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 != (char *)0x0) {
    extract_reference_file("test_read_format_gtar_filename_eucjp.tar.Z");
    a = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L',',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
    iVar1 = archive_read_support_format_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
    iVar1 = archive_read_set_options((archive *)a,"hdrcharset=eucJP");
    if (iVar1 == 0) {
      wVar2 = archive_read_open_filename(a,"test_read_format_gtar_filename_eucjp.tar.Z",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'5',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",a);
      iVar1 = archive_read_next_header((archive *)a,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L':',anon_var_dwarf_9136d + 0x36,"\"\\xe6\\xbc\\xa2\\xe5\\xad\\x97.txt\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar4 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L';',8,"8",lVar4,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)a,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'?',anon_var_dwarf_6a8e9 + 0x10,"\"\\xe8\\xa1\\xa8.txt\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar4 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'@',4,"4",lVar4,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'A',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'B',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
      iVar1 = archive_read_next_header((archive *)a,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'F',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
      iVar1 = archive_filter_code((archive *)a,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'I',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)",
                          a);
      iVar1 = archive_format((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'J',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)",
                          a);
      iVar1 = archive_read_close((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'M',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'0');
      test_skipping("This system cannot convert character-set from eucJP to UTF-8.");
    }
    iVar1 = archive_read_free((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'O',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'\'');
  test_skipping("en_US.UTF-8 locale not available on this system.");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_gtar_filename_eucJP_UTF8)
{
	const char *refname = "test_read_format_gtar_filename_eucjp.tar.Z";
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read eucJP filename in en_US.UTF-8 with "hdrcharset=eucJP" option.
	 */
	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=eucJP")) {
		skipping("This system cannot convert character-set"
		    " from eucJP to UTF-8.");
		goto cleanup;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xe6\xbc\xa2\xe5\xad\x97.txt",
	    archive_entry_pathname(ae));
	assertEqualInt(8, archive_entry_size(ae));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xe8\xa1\xa8.txt", archive_entry_pathname(ae));
	assertEqualInt(4, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_COMPRESS, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_TAR_GNUTAR, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}